

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::reLoad(SPxSolverBase<double> *this)

{
  SPxSolverBase<double> *in_RDI;
  
  forceRecompNonbasicValue(in_RDI);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  (*(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase[8])(&in_RDI->super_SPxBasisBase<double>)
  ;
  (in_RDI->super_SPxBasisBase<double>).theLP = in_RDI;
  in_RDI->m_status = UNKNOWN;
  if (in_RDI->thepricer != (SPxPricer<double> *)0x0) {
    (*in_RDI->thepricer->_vptr_SPxPricer[2])();
  }
  if (in_RDI->theratiotester != (SPxRatioTester<double> *)0x0) {
    (*in_RDI->theratiotester->_vptr_SPxRatioTester[2])();
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reLoad()
{
   forceRecompNonbasicValue();
   unInit();
   this->unLoad();
   this->theLP = this;
   m_status = SPxSolverBase<R>::UNKNOWN;

   if(thepricer)
      thepricer->clear();

   if(theratiotester)
      theratiotester->clear();
}